

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rbt_pars.cpp
# Opt level: O3

void __thiscall
icu_63::TransliteratorParser::setVariableRange
          (TransliteratorParser *this,int32_t start,int32_t end,UErrorCode *status)

{
  if (((end < 0x10000) && (-1 < start)) && (start <= end)) {
    this->curData->variablesBase = (UChar)start;
    if ((this->dataVector).count != 0) {
      return;
    }
    this->variableNext = (UChar)start;
    this->variableLimit = (short)end + L'\x01';
    return;
  }
  *status = U_MALFORMED_PRAGMA;
  return;
}

Assistant:

void TransliteratorParser::setVariableRange(int32_t start, int32_t end, UErrorCode& status) {
    if (start > end || start < 0 || end > 0xFFFF) {
        status = U_MALFORMED_PRAGMA;
        return;
    }
    
    curData->variablesBase = (UChar) start;
    if (dataVector.size() == 0) {
        variableNext = (UChar) start;
        variableLimit = (UChar) (end + 1);
    }
}